

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xgemm.c
# Opt level: O3

void xb_zgemm(char *transa,char *transb,int *M,int *N,int *K,void *alpha,void *a,int *p_lda,void *b,
             int *p_ldb,void *beta,void *c,int *p_ldc)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double *pdVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  double *pdVar14;
  int iVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  double *pdVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  ulong local_60;
  
  iVar1 = *M;
  iVar2 = *N;
  iVar12 = *K;
  if (iVar1 <= *p_ldc && (0 < iVar12 && (0 < iVar2 && 0 < iVar1))) {
    uVar3 = *p_lda;
    uVar4 = *p_ldb;
    iVar5 = iVar12;
    if ((byte)(*transa | 0x20U) == 0x6e) {
      iVar5 = iVar1;
    }
    if (iVar5 <= (int)uVar3) {
      iVar5 = iVar2;
      if ((byte)(*transb | 0x20U) == 0x6e) {
        iVar5 = iVar12;
      }
      if (iVar5 <= (int)uVar4) {
        dVar23 = *alpha;
        if (((((dVar23 != 0.0) || (NAN(dVar23))) || (*(double *)((long)alpha + 8) != 0.0)) ||
            ((NAN(*(double *)((long)alpha + 8)) || (*beta != 1.0)))) ||
           ((NAN(*beta) ||
            ((*(double *)((long)beta + 8) != 0.0 || (NAN(*(double *)((long)beta + 8)))))))) {
          if ((byte)(*transa | 0x20U) == 0x6e) {
            lVar17 = (ulong)uVar3 * 2;
            local_60 = 2;
          }
          else {
            local_60 = (ulong)(uVar3 * 2);
            lVar17 = 2;
          }
          if ((byte)(*transb | 0x20U) == 0x6e) {
            lVar18 = (ulong)uVar4 * 2;
            uVar22 = 2;
          }
          else {
            uVar22 = (ulong)(uVar4 * 2);
            lVar18 = 2;
          }
          iVar5 = *p_ldc * 2;
          if ((((dVar23 != 0.0) || (NAN(dVar23))) || (*(double *)((long)alpha + 8) != 0.0)) ||
             (NAN(*(double *)((long)alpha + 8)))) {
            if (((dVar23 != 1.0) || (NAN(dVar23))) ||
               ((*(double *)((long)alpha + 8) != 0.0 || (NAN(*(double *)((long)alpha + 8)))))) {
              pdVar16 = (double *)((long)a + 8);
              lVar20 = 0;
              iVar11 = 0;
              do {
                iVar15 = 0;
                lVar19 = lVar20;
                pdVar14 = (double *)((long)b + 8);
                do {
                  dVar23 = 0.0;
                  dVar24 = 0.0;
                  pdVar10 = pdVar14;
                  pdVar21 = pdVar16;
                  iVar13 = iVar12;
                  do {
                    dVar25 = *pdVar21;
                    if ((byte)(*transa | 0x20U) == 99) {
                      dVar25 = -dVar25;
                    }
                    dVar26 = *pdVar10;
                    if ((byte)(*transb | 0x20U) == 99) {
                      dVar26 = -dVar26;
                    }
                    dVar23 = dVar23 + dVar26 * pdVar21[-1] + dVar25 * pdVar10[-1];
                    dVar24 = dVar24 + pdVar10[-1] * pdVar21[-1] + -dVar25 * dVar26;
                    pdVar10 = pdVar10 + uVar22;
                    pdVar21 = pdVar21 + lVar17;
                    iVar13 = iVar13 + -1;
                  } while (iVar13 != 0);
                  dVar25 = *(double *)((long)c + lVar19 * 8);
                  dVar26 = *(double *)((long)c + lVar19 * 8 + 8);
                  dVar6 = *alpha;
                  dVar7 = *(double *)((long)alpha + 8);
                  dVar8 = *beta;
                  dVar9 = *(double *)((long)beta + 8);
                  pdVar10 = (double *)((long)c + lVar19 * 8);
                  *pdVar10 = dVar25 * dVar8 + dVar9 * -dVar26 + dVar24 * dVar6 + dVar7 * -dVar23;
                  pdVar10[1] = dVar25 * dVar9 + dVar8 * dVar26 + dVar24 * dVar7 + dVar6 * dVar23;
                  iVar15 = iVar15 + 1;
                  lVar19 = lVar19 + iVar5;
                  pdVar14 = pdVar14 + lVar18;
                } while (iVar15 != iVar2);
                iVar11 = iVar11 + 1;
                lVar20 = lVar20 + 2;
                pdVar16 = pdVar16 + local_60;
              } while (iVar11 != iVar1);
            }
            else if (((*beta != 0.0) || (NAN(*beta))) ||
                    ((*(double *)((long)beta + 8) != 0.0 || (NAN(*(double *)((long)beta + 8)))))) {
              pdVar16 = (double *)((long)a + 8);
              lVar20 = 0;
              iVar11 = 0;
              do {
                iVar15 = 0;
                pdVar14 = (double *)((long)b + 8);
                lVar19 = lVar20;
                do {
                  dVar23 = 0.0;
                  dVar24 = 0.0;
                  pdVar10 = pdVar14;
                  pdVar21 = pdVar16;
                  iVar13 = iVar12;
                  do {
                    dVar25 = *pdVar21;
                    if ((byte)(*transa | 0x20U) == 99) {
                      dVar25 = -dVar25;
                    }
                    dVar26 = *pdVar10;
                    if ((byte)(*transb | 0x20U) == 99) {
                      dVar26 = -dVar26;
                    }
                    dVar23 = dVar23 + pdVar10[-1] * pdVar21[-1] + -dVar25 * dVar26;
                    dVar24 = dVar24 + dVar26 * pdVar21[-1] + dVar25 * pdVar10[-1];
                    pdVar10 = pdVar10 + uVar22;
                    pdVar21 = pdVar21 + lVar17;
                    iVar13 = iVar13 + -1;
                  } while (iVar13 != 0);
                  dVar25 = *(double *)((long)c + lVar19 * 8);
                  dVar26 = *(double *)((long)c + lVar19 * 8 + 8);
                  dVar6 = *beta;
                  dVar7 = *(double *)((long)beta + 8);
                  pdVar10 = (double *)((long)c + lVar19 * 8);
                  *pdVar10 = dVar23 + dVar25 * dVar6 + dVar7 * -dVar26;
                  pdVar10[1] = dVar24 + dVar25 * dVar7 + dVar6 * dVar26;
                  iVar15 = iVar15 + 1;
                  lVar19 = lVar19 + iVar5;
                  pdVar14 = pdVar14 + lVar18;
                } while (iVar15 != iVar2);
                iVar11 = iVar11 + 1;
                lVar20 = lVar20 + 2;
                pdVar16 = pdVar16 + local_60;
              } while (iVar11 != iVar1);
            }
            else {
              pdVar16 = (double *)((long)a + 8);
              lVar20 = 0;
              iVar11 = 0;
              do {
                iVar15 = 0;
                pdVar14 = (double *)((long)b + 8);
                lVar19 = lVar20;
                do {
                  dVar23 = 0.0;
                  dVar24 = 0.0;
                  pdVar10 = pdVar16;
                  pdVar21 = pdVar14;
                  iVar13 = iVar12;
                  do {
                    dVar25 = *pdVar10;
                    if ((byte)(*transa | 0x20U) == 99) {
                      dVar25 = -dVar25;
                    }
                    dVar26 = *pdVar21;
                    if ((byte)(*transb | 0x20U) == 99) {
                      dVar26 = -dVar26;
                    }
                    dVar23 = dVar23 + pdVar21[-1] * pdVar10[-1] + -dVar25 * dVar26;
                    dVar24 = dVar24 + dVar26 * pdVar10[-1] + dVar25 * pdVar21[-1];
                    pdVar21 = pdVar21 + uVar22;
                    pdVar10 = pdVar10 + lVar17;
                    iVar13 = iVar13 + -1;
                  } while (iVar13 != 0);
                  pdVar10 = (double *)((long)c + lVar19 * 8);
                  *pdVar10 = dVar23;
                  pdVar10[1] = dVar24;
                  iVar15 = iVar15 + 1;
                  lVar19 = lVar19 + iVar5;
                  pdVar14 = pdVar14 + lVar18;
                } while (iVar15 != iVar2);
                iVar11 = iVar11 + 1;
                lVar20 = lVar20 + 2;
                pdVar16 = pdVar16 + local_60;
              } while (iVar11 != iVar1);
            }
          }
          else {
            iVar11 = 0;
            iVar12 = iVar2;
            pdVar16 = (double *)c;
            do {
              do {
                dVar23 = *c;
                dVar24 = *beta;
                dVar25 = *(double *)((long)beta + 8);
                *(double *)c = dVar23 * dVar24 + dVar25 * -*(double *)((long)c + 8);
                *(double *)((long)c + 8) = dVar23 * dVar25 + dVar24 * *(double *)((long)c + 8);
                c = (void *)((long)c + (long)iVar5 * 8);
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
              iVar11 = iVar11 + 1;
              c = pdVar16 + 2;
              iVar12 = iVar2;
              pdVar16 = (double *)c;
            } while (iVar11 != iVar1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
xb_zgemm (char * transa, char *transb, int *M, int *N, int *K,
	  const void *alpha, const void *a, int *p_lda, const void *b, 
	  int *p_ldb, const void *beta, void *c, int *p_ldc)
/* 
 * Purpose
 * =======
 *
 * This routine computes the matrix product:
 *
 *      C   <-  alpha * op(A) * op(B)  +  beta * C .
 * 
 * where op(M) represents either M, M transpose, 
 * or M conjugate transpose.
 *
 * Arguments
 * =========
 *
 * order   (input) enum blas_order_type
 *         Storage  of input matrices A, B, and C.
 *
 * transa  (input) enum blas_trans_type
 *         Operation to be done on matrix A before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 *
 * transb  (input) enum blas_trans_type
 *         Operation to be done on matrix B before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 * 
 * m n k   (input) int
 *         The dimensions of matrices A, B, and C.
 *         Matrix C is m-by-n matrix.
 *         Matrix A is m-by-k if A is not transposed, 
 *                     k-by-m otherwise.
 *         Matrix B is k-by-n if B is not transposed, 
 *                     n-by-k otherwise.
 *      
 * alpha   (input) const void*
 *
 * a       (input) const void*
 *         matrix A.
 * 
 * lda     (input) int
 *         leading dimension of A.
 * 
 * b       (input) const void*
 *         matrix B
 *
 * ldb     (input) int
 *         leading dimension of B.
 *
 * beta    (input) const void*
 *
 * c       (input/output) void*
 *         matrix C
 *
 * ldc     (input) int
 *         leading dimension of C.
 *
 */
{


    /* Integer Index Variables */
    int i, j, h;

    int ai, bj, ci;
    int aih, bhj, cij;		/* Index into matrices a, b, c during multiply */

    int incai, incaih;		/* Index increments for matrix a */
    int incbj, incbhj;		/* Index increments for matrix b */
    int incci, inccij;		/* Index increments for matrix c */

    /* Input Matrices */
    const double *a_i = (double *) a;
    const double *b_i = (double *) b;

    /* Output Matrix */
    double *c_i = (double *) c;

    /* Input Scalars */
    double *alpha_i = (double *) alpha;
    double *beta_i = (double *) beta;
    int m=*M, n=*N, k=*K;
    int lda=*p_lda, ldb=*p_ldb, ldc=*p_ldc;

    /* Temporary Floating-Point Variables */
    double a_elem[2];
    double b_elem[2];
    double c_elem[2];
    double prod[2];
    double sum[2];
    double tmp1[2];
    double tmp2[2];

    char order = COLMAJOR; /* For the time being, it is always COLMAJOR.
			      Eventually, it might change. */

#if MDEBUG
    printf("In Zgemm\n");
#endif

    /* Test for error conditions */
    if (m <= 0 || n <= 0 || k <= 0)
    {
	return;
    }

    if (order == COLMAJOR)
    {

	if (ldc < m)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < m)
		return;
	}
	else
	{
	    if (lda < k)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < k)
		return;
	}
	else
	{
	    if (ldb < n)
		return;
	}

    }
    else
    {
	/* row major */
	if (ldc < n)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < k)
		return;
	}
	else
	{
	    if (lda < m)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < n)
		return;
	}
	else
	{
	    if (ldb < k)
		return;
	}
    }

    /* Test for no-op */
    if (alpha_i[0] == 0.0 && alpha_i[1] == 0.0
	&& (beta_i[0] == 1.0 && beta_i[1] == 0.0))
    {
	return;
    }

    /* Set Index Parameters */
    if (order == COLMAJOR)
    {
	incci = 1;
	inccij = ldc;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = 1;
	    incaih = lda;
	}
	else
	{
	    incai = lda;
	    incaih = 1;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = ldb;
	    incbhj = 1;
	}
	else
	{
	    incbj = 1;
	    incbhj = ldb;
	}

    }
    else
    {
	/* row major */
	incci = ldc;
	inccij = 1;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = lda;
	    incaih = 1;
	}
	else
	{
	    incai = 1;
	    incaih = lda;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = 1;
	    incbhj = ldb;
	}
	else
	{
	    incbj = ldb;
	    incbhj = 1;
	}

    }



    /* Ajustment to increments */
    incci *= 2;
    inccij *= 2;
    incai *= 2;
    incaih *= 2;
    incbj *= 2;
    incbhj *= 2;

    /* alpha = 0.  In this case, just return beta * C */
    if (alpha_i[0] == 0.0 && alpha_i[1] == 0.0)
    {

	ci = 0;
	for (i = 0; i < m; i++, ci += incci)
	{
	    cij = ci;
	    for (j = 0; j < n; j++, cij += inccij)
	    {
		c_elem[0] = c_i[cij];
		c_elem[1] = c_i[cij + 1];
		{
		    tmp1[0] =
			(double) c_elem[0] * beta_i[0] -
			(double) c_elem[1] * beta_i[1];
		    tmp1[1] =
			(double) c_elem[0] * beta_i[1] +
			(double) c_elem[1] * beta_i[0];
		}
		c_i[cij] = tmp1[0];
		c_i[cij + 1] = tmp1[1];
	    }
	}

    }
    else if ((alpha_i[0] == 1.0 && alpha_i[1] == 0.0))
    {

	/* Case alpha == 1. */

	if (beta_i[0] == 0.0 && beta_i[1] == 0.0)
	{
	    /* Case alpha == 1, beta == 0.   We compute  C <--- A * B */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum[0] = sum[1] = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem[0] = a_i[aih];
			a_elem[1] = a_i[aih + 1];
			b_elem[0] = b_i[bhj];
			b_elem[1] = b_i[bhj + 1];
			if (*transa == 'c' || *transa == 'C')
			{
			  a_elem[1] = -a_elem[1];
			}
			if (*transb == 'c' || *transb == 'C')
			{
			    b_elem[1] = -b_elem[1];
			}
			
			{
			    prod[0] =
				(double) a_elem[0] * b_elem[0] -
				(double) a_elem[1] * b_elem[1];
			    prod[1] =
				(double) a_elem[0] * b_elem[1] +
				(double) a_elem[1] * b_elem[0];
			}
			sum[0] = sum[0] + prod[0];
			sum[1] = sum[1] + prod[1];
		    }
		    tmp1[0] = sum[0];
		    tmp1[1] = sum[1];
		    c_i[cij] = tmp1[0];
		    c_i[cij + 1] = tmp1[1];
		}
	    }

	}
	else
	{
	    /* Case alpha == 1, but beta != 0.
	       We compute   C <--- A * B + beta * C   */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum[0] = sum[1] = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem[0] = a_i[aih];
			a_elem[1] = a_i[aih + 1];
			b_elem[0] = b_i[bhj];
			b_elem[1] = b_i[bhj + 1];
			if (*transa == 'c' || *transa == 'C')
			{
			    a_elem[1] = -a_elem[1];
			}
			if (*transb == 'c' || *transb == 'C')
			{
			    b_elem[1] = -b_elem[1];
			}
			{
			    prod[0] =
				(double) a_elem[0] * b_elem[0] -
				(double) a_elem[1] * b_elem[1];
			    prod[1] =
				(double) a_elem[0] * b_elem[1] +
				(double) a_elem[1] * b_elem[0];
			}
			sum[0] = sum[0] + prod[0];
			sum[1] = sum[1] + prod[1];
		    }

		    c_elem[0] = c_i[cij];
		    c_elem[1] = c_i[cij + 1];
		    {
			tmp2[0] =
			    (double) c_elem[0] * beta_i[0] -
			    (double) c_elem[1] * beta_i[1];
			tmp2[1] =
			    (double) c_elem[0] * beta_i[1] +
			    (double) c_elem[1] * beta_i[0];
		    }
		    tmp1[0] = sum[0];
		    tmp1[1] = sum[1];
		    tmp1[0] = tmp2[0] + tmp1[0];
		    tmp1[1] = tmp2[1] + tmp1[1];
		    c_i[cij] = tmp1[0];
		    c_i[cij + 1] = tmp1[1];
		}
	    }
	}

    }
    else
    {

	/* The most general form,   C <-- alpha * A * B + beta * C  */
	ci = 0;
	ai = 0;
	for (i = 0; i < m; i++, ci += incci, ai += incai)
	{

	    cij = ci;
	    bj = 0;

	    for (j = 0; j < n; j++, cij += inccij, bj += incbj)
	    {

		aih = ai;
		bhj = bj;

		sum[0] = sum[1] = 0.0;

		for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		{
		    a_elem[0] = a_i[aih];
		    a_elem[1] = a_i[aih + 1];
		    b_elem[0] = b_i[bhj];
		    b_elem[1] = b_i[bhj + 1];
		    if (*transa == 'c' || *transa == 'C')
		    {
			a_elem[1] = -a_elem[1];
		    }
		    if (*transb == 'c' || *transb == 'C')
		    {
			b_elem[1] = -b_elem[1];
		    }
		    {
			prod[0] =
			    (double) a_elem[0] * b_elem[0] -
			    (double) a_elem[1] * b_elem[1];
			prod[1] =
			    (double) a_elem[0] * b_elem[1] +
			    (double) a_elem[1] * b_elem[0];
		    }
		    sum[0] = sum[0] + prod[0];
		    sum[1] = sum[1] + prod[1];
		}

		{
		    tmp1[0] =
			(double) sum[0] * alpha_i[0] -
			(double) sum[1] * alpha_i[1];
		    tmp1[1] =
			(double) sum[0] * alpha_i[1] +
			(double) sum[1] * alpha_i[0];
		}
		c_elem[0] = c_i[cij];
		c_elem[1] = c_i[cij + 1];
		{
		    tmp2[0] =
			(double) c_elem[0] * beta_i[0] -
			(double) c_elem[1] * beta_i[1];
		    tmp2[1] =
			(double) c_elem[0] * beta_i[1] +
			(double) c_elem[1] * beta_i[0];
		}
		tmp1[0] = tmp1[0] + tmp2[0];
		tmp1[1] = tmp1[1] + tmp2[1];
		c_i[cij] = tmp1[0];
		c_i[cij + 1] = tmp1[1];
	    }
	}

    }



}